

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

BoxList * __thiscall amrex::ClusterList::boxList(ClusterList *this)

{
  bool bVar1;
  reference ppCVar2;
  BoxList *in_RDI;
  const_iterator End;
  const_iterator cli;
  BoxList *blst;
  BoxList *in_stack_ffffffffffffffa8;
  _Self local_38;
  _Self local_30 [3];
  undefined1 local_11;
  
  local_11 = 0;
  BoxList::BoxList(in_stack_ffffffffffffffa8);
  std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::size
            ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)in_RDI);
  BoxList::reserve(in_RDI,(size_t)in_stack_ffffffffffffffa8);
  local_30[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::begin
                 ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)
                  in_stack_ffffffffffffffa8);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::end
                 ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)
                  in_stack_ffffffffffffffa8);
  while (bVar1 = std::operator!=(local_30,&local_38), bVar1) {
    ppCVar2 = std::_List_const_iterator<amrex::Cluster_*>::operator*
                        ((_List_const_iterator<amrex::Cluster_*> *)in_RDI);
    Cluster::box(*ppCVar2);
    BoxList::push_back(in_RDI,(Box *)in_stack_ffffffffffffffa8);
    std::_List_const_iterator<amrex::Cluster_*>::operator++(local_30);
  }
  return in_RDI;
}

Assistant:

BoxList
ClusterList::boxList() const
{
    BoxList blst;
    blst.reserve(lst.size());
    for (std::list<Cluster*>::const_iterator cli = lst.begin(), End = lst.end();
         cli != End;
         ++cli)
    {
        blst.push_back((*cli)->box());
    }
    return blst;
}